

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recipient.c
# Opt level: O3

_Bool COSE_Recipient_Free(HCOSE_RECIPIENT hRecipient)

{
  _Bool _Var1;
  COSE_RecipientInfo *p;
  
  if (hRecipient != (HCOSE_RECIPIENT)0x0) {
    _Var1 = _COSE_IsInList(RecipientRoot,(COSE *)hRecipient);
    if (_Var1) {
      _COSE_RemoveFromList(&RecipientRoot,(COSE *)hRecipient);
      if (*(int *)(hRecipient + 0x10) < 2) {
        free(hRecipient);
      }
      else {
        *(int *)(hRecipient + 0x10) = *(int *)(hRecipient + 0x10) + -1;
      }
      _Var1 = true;
    }
    else {
      _Var1 = false;
    }
    return _Var1;
  }
  return false;
}

Assistant:

bool COSE_Recipient_Free(HCOSE_RECIPIENT hRecipient)
{
	if (IsValidRecipientHandle(hRecipient)) {
		COSE_RecipientInfo * p = (COSE_RecipientInfo *)hRecipient;
		_COSE_RemoveFromList(&RecipientRoot, &p->m_encrypt.m_message);

		_COSE_Recipient_Free(p);
		return true;
	}

	return false;
}